

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_benchmark.cpp
# Opt level: O1

int main(void)

{
  rt_expression_interface<double> rVar1;
  auto_ptr<viennamath::rt_expression_interface<double>_> aVar2;
  char cVar3;
  rt_expression_interface<double> *prVar4;
  op_interface<viennamath::rt_expression_interface<double>_> *poVar5;
  undefined4 extraout_var;
  long *plVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ostream *poVar7;
  int __flags;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  int iVar8;
  __fn *__fn;
  void *in_R8;
  double dVar9;
  double extraout_XMM0_Qa;
  double dVar10;
  expr e;
  expr e_opt;
  timeval tval;
  variable T;
  variable x;
  double mult;
  double local_148;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_138;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_130;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_128;
  long *local_120;
  long *local_118;
  long *local_110;
  undefined **local_108;
  long *local_100;
  long *local_f8;
  _func_int **local_f0;
  _func_int **local_e8;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_e0;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_c0;
  double local_a0;
  rt_variable<viennamath::rt_expression_interface<double>_> local_98;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_88;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_68;
  undefined **local_48;
  undefined8 local_40;
  double local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"**** ViennaMath performance benchmark ****",0x2a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Make sure that optimization flags (e.g. -O2) are set when benchmarking!",0x47);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enter \'1\': ",0xb);
  std::istream::_M_extract<double>((double *)&std::cin);
  local_f0 = (_func_int **)((local_38 + local_38) * local_38 * 3.0);
  local_e8 = (_func_int **)(local_38 * 1.61);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------- Naive (standard) implementation --------- ",0x34);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  gettimeofday((timeval *)&local_e0,(__timezone_ptr_t)0x0);
  aVar2._M_ptr = local_e0.lhs_._M_ptr;
  rVar1._vptr_rt_expression_interface =
       local_e0.super_rt_expression_interface<double>._vptr_rt_expression_interface;
  dVar10 = local_38 * 300.0 * 8.854e-12;
  local_a0 = (double)local_f0 / ((double)local_e8 * local_38 * 300.0);
  local_148 = 0.0;
  iVar8 = 1000000;
  do {
    dVar9 = exp(local_a0);
    local_148 = local_148 + dVar9 * (dVar10 + dVar10);
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  gettimeofday((timeval *)&local_e0,(__timezone_ptr_t)0x0);
  print_stats(local_148,
              (double)((long)local_e0.lhs_._M_ptr +
                      (((long)local_e0.super_rt_expression_interface<double>.
                              _vptr_rt_expression_interface -
                       (long)rVar1._vptr_rt_expression_interface) * 1000000 - (long)aVar2._M_ptr)) /
              1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "--------- Hand tuned implementation (best possible, but will never be achieved within a simulator) --------- "
             ,0x6d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  gettimeofday((timeval *)&local_e0,(__timezone_ptr_t)0x0);
  aVar2._M_ptr = local_e0.lhs_._M_ptr;
  rVar1._vptr_rt_expression_interface =
       local_e0.super_rt_expression_interface<double>._vptr_rt_expression_interface;
  dVar10 = 0.0;
  iVar8 = 1000000;
  do {
    dVar10 = dVar10 + 5.3788048e-09;
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  gettimeofday((timeval *)&local_e0,(__timezone_ptr_t)0x0);
  print_stats(dVar10,(double)((long)local_e0.lhs_._M_ptr +
                             (((long)local_e0.super_rt_expression_interface<double>.
                                     _vptr_rt_expression_interface -
                              (long)rVar1._vptr_rt_expression_interface) * 1000000 -
                             (long)aVar2._M_ptr)) / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------- ViennaMath (runtime) --------- ",0x29);
  cVar3 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  __fn = (__fn *)(ulong)(uint)(int)cVar3;
  std::ostream::put(-0x48);
  std::ostream::flush();
  local_48 = &PTR__rt_expression_interface_00112898;
  local_40 = 0;
  local_98.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_00112898;
  local_98.id_ = 1;
  prVar4 = (rt_expression_interface<double> *)operator_new(0x10);
  prVar4->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_expression_interface_00112898;
  prVar4[1]._vptr_rt_expression_interface = (_func_int **)0x1;
  poVar5 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar5->_vptr_op_interface = (_func_int **)&PTR__op_interface_001129d8;
  local_68.rhs_._M_ptr = (rt_expression_interface<double> *)operator_new(0x10);
  (local_68.rhs_._M_ptr)->_vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_00112718;
  __flags = -0x1ff15826;
  local_68.rhs_._M_ptr[1]._vptr_rt_expression_interface = (_func_int **)0x3da3785be00ea7da;
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_00112648;
  local_68.lhs_._M_ptr = prVar4;
  local_68.op_._M_ptr = poVar5;
  iVar8 = viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                    (&local_68,__fn,__child_stack,-0x1ff15826,in_R8);
  plVar6 = (long *)operator_new(8);
  *plVar6 = (long)&PTR__op_interface_001129d8;
  local_110 = (long *)(*(code *)local_48[2])();
  local_128._M_ptr = (rt_expression_interface<double> *)&PTR__rt_binary_expr_00112648;
  local_120 = (long *)CONCAT44(extraout_var,iVar8);
  local_118 = plVar6;
  prVar4 = (rt_expression_interface<double> *)operator_new(0x10);
  prVar4->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_expression_interface_00112718;
  prVar4[1]._vptr_rt_expression_interface = local_e8;
  poVar5 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar5->_vptr_op_interface = (_func_int **)&PTR__op_interface_001129d8;
  iVar8 = (*local_98.super_rt_expression_interface<double>._vptr_rt_expression_interface[2])();
  local_c0.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_00,iVar8);
  local_c0.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_00112648;
  local_c0.lhs_._M_ptr = prVar4;
  local_c0.op_._M_ptr = poVar5;
  prVar4 = (rt_expression_interface<double> *)operator_new(0x10);
  prVar4->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_expression_interface_00112718;
  prVar4[1]._vptr_rt_expression_interface = local_f0;
  poVar5 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar5->_vptr_op_interface = (_func_int **)&PTR__op_interface_00112bf8;
  iVar8 = viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                    (&local_c0,__fn,__child_stack_00,__flags,in_R8);
  local_88.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_01,iVar8);
  local_88.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_00112648;
  local_88.lhs_._M_ptr = prVar4;
  local_88.op_._M_ptr = poVar5;
  iVar8 = viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                    (&local_88,__fn,__child_stack_01,__flags,in_R8);
  local_f8 = (long *)operator_new(0x10);
  *local_f8 = (long)&PTR__op_interface_00112d18;
  local_108 = &PTR__rt_unary_expr_001127d8;
  local_100 = (long *)CONCAT44(extraout_var_02,iVar8);
  prVar4 = (rt_expression_interface<double> *)
           (*(code *)local_128._M_ptr[2]._vptr_rt_expression_interface)();
  poVar5 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar5->_vptr_op_interface = (_func_int **)&PTR__op_interface_001129d8;
  local_e0.rhs_._M_ptr = (rt_expression_interface<double> *)(*(code *)local_108[2])();
  local_e0.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_00112648;
  local_e0.lhs_._M_ptr = prVar4;
  local_e0.op_._M_ptr = poVar5;
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_138,&local_e0);
  local_e0.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_00112648;
  if (local_e0.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_e0.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_e0.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_e0.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_e0.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_e0.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_108 = &PTR__rt_unary_expr_001127d8;
  if (local_f8 != (long *)0x0) {
    (**(code **)(*local_f8 + 8))();
  }
  if (local_100 != (long *)0x0) {
    (**(code **)(*local_100 + 8))();
  }
  local_88.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_00112648;
  if (local_88.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_88.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_88.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_88.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_88.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_88.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_c0.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_00112648;
  if (local_c0.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_c0.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_c0.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_c0.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_c0.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_c0.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_128._M_ptr = (rt_expression_interface<double> *)&PTR__rt_binary_expr_00112648;
  if (local_110 != (long *)0x0) {
    (**(code **)(*local_110 + 8))();
  }
  if (local_118 != (long *)0x0) {
    (**(code **)(*local_118 + 8))();
  }
  if (local_120 != (long *)0x0) {
    (**(code **)(*local_120 + 8))();
  }
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_00112648;
  if (local_68.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_68.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_68.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_68.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Expression before substitution: ",0x20);
  poVar7 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_138);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  viennamath::substitute<viennamath::rt_expression_interface<double>>
            ((viennamath *)&local_128,&local_98,300.0,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_138);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Expression after substitution: ",0x1f);
  poVar7 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  gettimeofday((timeval *)&local_e0,(__timezone_ptr_t)0x0);
  aVar2._M_ptr = local_e0.lhs_._M_ptr;
  rVar1._vptr_rt_expression_interface =
       local_e0.super_rt_expression_interface<double>._vptr_rt_expression_interface;
  local_148 = 0.0;
  iVar8 = 1000000;
  do {
    viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
              ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_130,
               (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128);
    (*(local_130._M_ptr)->_vptr_rt_expression_interface[6])(0x4000000000000000);
    if (local_130._M_ptr != (rt_expression_interface<double> *)0x0) {
      (*(local_130._M_ptr)->_vptr_rt_expression_interface[1])();
    }
    local_148 = local_148 + extraout_XMM0_Qa;
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  gettimeofday((timeval *)&local_e0,(__timezone_ptr_t)0x0);
  print_stats(local_148,
              (double)((long)local_e0.lhs_._M_ptr +
                      (((long)local_e0.super_rt_expression_interface<double>.
                              _vptr_rt_expression_interface -
                       (long)rVar1._vptr_rt_expression_interface) * 1000000 - (long)aVar2._M_ptr)) /
              1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------- ViennaMath (compiletime) --------- ",0x2d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"|  * (not possible in this case)",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"****************************************************",0x34);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"*****     TUTORIAL COMPLETED SUCCESSFULLY!     *****",0x34);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"****************************************************",0x34);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  if (local_128._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_128._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_138._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_138._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  return 0;
}

Assistant:

int main()
{
  Timer timer;
  double elapsed;
  double result = 0;
  double x_ref = 2.0;
  double T_ref = 300;
  double kb = 1.61;
  double voltage = 3.0;
  double prefactor = 2.0;
  double eps = 8.854e-12;

  double mult;

  std::cout << "**** ViennaMath performance benchmark ****" << std::endl;
  std::cout << "Make sure that optimization flags (e.g. -O2) are set when benchmarking!" << std::endl;

  //
  // First step: disable precomputations by the compiler for naive implementation
  // If not specified at runtime, compiler might detect voltage and prefactor to be constants and precompute results
  std::cout << "Enter '1': ";
  std::cin >> mult;
  voltage *= mult;
  prefactor *= mult;
  T_ref *= mult;
  kb *= mult;

  std::cout << "--------- Naive (standard) implementation --------- " << std::endl;

  //the reference implementation:
  timer.start();
  for (int i=0; i<BENCHMARK_SIZE; ++i)
    result += (T_ref * eps * x_ref * ::exp( prefactor * voltage / (kb * T_ref) ) );
  elapsed = timer.get();


  print_stats(result, elapsed);


  std::cout << "--------- Hand tuned implementation (best possible, but will never be achieved within a simulator) --------- " << std::endl;

  //the reference implementation:
  result = 0;
  timer.start();
  for (int i=0; i<BENCHMARK_SIZE; ++i)
    result += 2.6894024e-9 * x_ref;
  elapsed = timer.get();

  print_stats(result, elapsed);



  std::cout << "--------- ViennaMath (runtime) --------- " << std::endl;

  //ViennaMath:
  viennamath::variable  x(0);
  viennamath::variable  T(1);
  viennamath::expr e = (T * eps * x * viennamath::exp( prefactor * voltage / (kb * T) ) );
  std::cout << "Expression before substitution: " << e << std::endl;
  viennamath::expr e_opt = viennamath::substitute(T, 300.0, e);
  std::cout << "Expression after substitution: " << e_opt << std::endl;
  result = 0;
  timer.start();
  for (int i=0; i<BENCHMARK_SIZE; ++i)
    result += viennamath::eval(e_opt, 2.0);
  elapsed = timer.get();

  print_stats(result, elapsed);


  std::cout << "--------- ViennaMath (compiletime) --------- " << std::endl;
  std::cout << "|" << std::endl;
  std::cout << "|  * (not possible in this case)" << std::endl;
  std::cout << "|" << std::endl;

  std::cout << "****************************************************" << std::endl;
  std::cout << "*****     TUTORIAL COMPLETED SUCCESSFULLY!     *****" << std::endl;
  std::cout << "****************************************************" << std::endl;

  return EXIT_SUCCESS;
}